

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  value_type vVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  reference pvVar2;
  reference pvVar3;
  Scalar *pSVar4;
  ostream *poVar5;
  MatrixXd se;
  int i;
  int j;
  MatrixXd y;
  MatrixXd X;
  vector<double,_std::allocator<double>_> labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  dataset;
  ANN n;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffffb58;
  ANN *in_stack_fffffffffffffb60;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffb68;
  ostream *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb78;
  ostream *in_stack_fffffffffffffb80;
  allocator_type *in_stack_fffffffffffffb88;
  allocator<char> *in_stack_fffffffffffffb90;
  iterator in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  int *in_stack_fffffffffffffbb0;
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffffbb8;
  MatrixXd *in_stack_fffffffffffffbe0;
  ANN *in_stack_fffffffffffffbe8;
  undefined1 ****local_3f8;
  string *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  int size;
  ANN *in_stack_fffffffffffffc20;
  MatrixXd *y_00;
  MatrixXd *X_00;
  ANN *this;
  int local_298;
  int local_294;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  undefined8 local_220;
  vector<double,_std::allocator<double>_> local_218;
  undefined1 local_1fa;
  undefined1 local_1f9 [25];
  undefined8 local_1e0;
  undefined1 local_1d1 [65];
  undefined8 local_190;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 *local_170;
  undefined8 local_168;
  MatrixXd *local_160;
  undefined1 ***local_158 [3];
  undefined1 local_140 [24];
  MatrixXd local_128;
  undefined1 local_110 [24];
  undefined8 ***local_f8;
  undefined8 local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_e8;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [48];
  ANN local_48;
  int local_4;
  
  size = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  local_4 = 0;
  ANN::ANN(in_stack_fffffffffffffb60);
  ANN::setLearningRate(&local_48,0.1);
  ANN::setInputSize(&local_48,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  ANN::addLayer(in_stack_fffffffffffffc20,size,in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  ANN::addLayer(in_stack_fffffffffffffc20,size,in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  ANN::addLayer(in_stack_fffffffffffffc20,size,in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_1fa = 1;
  local_160 = (MatrixXd *)local_158;
  local_180 = 0;
  local_178 = 0;
  local_170 = &local_180;
  local_168 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13f886);
  __l._M_len = (size_type)in_stack_fffffffffffffba0;
  __l._M_array = (iterator)in_stack_fffffffffffffb98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,__l,
             in_stack_fffffffffffffb88);
  local_160 = (MatrixXd *)local_140;
  local_1d1._41_8_ = 0;
  local_1d1._49_8_ = 0x3ff0000000000000;
  local_1d1._57_8_ = local_1d1 + 0x29;
  local_190 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13f914);
  __l_00._M_len = (size_type)in_stack_fffffffffffffba0;
  __l_00._M_array = (iterator)in_stack_fffffffffffffb98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,__l_00,
             in_stack_fffffffffffffb88);
  X_00 = &local_128;
  local_1d1._1_8_ = 0x3ff0000000000000;
  local_1d1._9_8_ = 0;
  local_1d1._17_8_ = local_1d1 + 1;
  local_1d1._25_8_ = 2;
  this = (ANN *)local_1d1;
  local_160 = X_00;
  std::allocator<double>::allocator((allocator<double> *)0x13f9a2);
  __l_01._M_len = (size_type)in_stack_fffffffffffffba0;
  __l_01._M_array = (iterator)in_stack_fffffffffffffb98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,__l_01,
             in_stack_fffffffffffffb88);
  local_160 = (MatrixXd *)local_110;
  local_1f9._1_8_ = 0x3ff0000000000000;
  local_1f9._9_8_ = 0x3ff0000000000000;
  local_1f9._17_8_ = local_1f9 + 1;
  local_1e0 = 2;
  y_00 = (MatrixXd *)local_1f9;
  std::allocator<double>::allocator((allocator<double> *)0x13fa2c);
  __l_02._M_len = (size_type)in_stack_fffffffffffffba0;
  __l_02._M_array = (iterator)in_stack_fffffffffffffb98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,__l_02,
             in_stack_fffffffffffffb88);
  local_1fa = 0;
  local_f8 = local_158;
  local_f0 = 4;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13fa8c);
  __l_03._M_len = (size_type)in_stack_fffffffffffffba0;
  __l_03._M_array = in_stack_fffffffffffffb98;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffb90,__l_03,(allocator_type *)in_stack_fffffffffffffb88);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13fac0);
  local_3f8 = (undefined1 ****)&local_f8;
  do {
    local_3f8 = local_3f8 + -3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
  } while (local_3f8 != local_158);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb1f);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb2c);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb39);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb46);
  local_238 = 0x3ff0000000000000;
  uStack_230 = 0xbff0000000000000;
  local_248 = 0xbff0000000000000;
  uStack_240 = 0x3ff0000000000000;
  local_228 = &local_248;
  local_220 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x13fb95);
  __l_04._M_len = (size_type)in_stack_fffffffffffffba0;
  __l_04._M_array = (iterator)in_stack_fffffffffffffb98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,__l_04,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x13fbc9);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,(int *)in_stack_fffffffffffffb70);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,(int *)in_stack_fffffffffffffb70);
  for (local_294 = 0; local_294 < 4; local_294 = local_294 + 1) {
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_e8,(long)local_294);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
    in_stack_fffffffffffffbe0 = (MatrixXd *)*pvVar3;
    in_stack_fffffffffffffbe8 =
         (ANN *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78,
                           (Index)in_stack_fffffffffffffb70);
    (in_stack_fffffffffffffbe8->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffbe0;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_e8,(long)local_294);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,1);
    vVar1 = *pvVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78,
                        (Index)in_stack_fffffffffffffb70);
    *pSVar4 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_218,(long)local_294);
    in_stack_fffffffffffffbb0 = (int *)*pvVar3;
    in_stack_fffffffffffffbb8 =
         (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78,
                       (Index)in_stack_fffffffffffffb70);
    *(int **)in_stack_fffffffffffffbb8 = in_stack_fffffffffffffbb0;
  }
  for (local_298 = 0; local_298 < 1000; local_298 = local_298 + 1) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb60,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb58);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb60,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb58);
    ANN::fit(this,X_00,y_00);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1400aa)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1400b7)
    ;
    if (local_298 % 10 == 0) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb60,
                 (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb58);
      ANN::predict(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb88,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb80)
      ;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::array(in_stack_fffffffffffffb68);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::pow<int>(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x140189);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x140196);
      in_stack_fffffffffffffb80 = std::operator<<((ostream *)&std::cout,"Epoch: ");
      poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb80,local_298);
      in_stack_fffffffffffffb70 = std::operator<<(poVar5," MSE: ");
      in_stack_fffffffffffffb68 =
           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffffb70);
      in_stack_fffffffffffffb60 =
           (ANN *)std::ostream::operator<<
                            (in_stack_fffffffffffffb70,(double)in_stack_fffffffffffffb68);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14022c);
    }
  }
  local_4 = 0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140316);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140323);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffb70);
  ANN::~ANN(in_stack_fffffffffffffb60);
  return local_4;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setLearningRate(0.1);
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    vector<vector<double>> dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> labels = {-1, 1, 1, -1};
    
    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = dataset[j][0];
        X(j,1) = dataset[j][1];
        y(j,0) = labels[j];
    }
    
    for(int i = 0; i < 1000; i++) {
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << "Epoch: " << i << " MSE: " << se.mean() << endl;
        }
    }
    return 0;
}